

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

void merge_lcp_2way_unstable<true>
               (uchar **from0,lcp_t *lcp_input0,size_t n0,uchar **from1,lcp_t *lcp_input1,size_t n1,
               uchar **result,lcp_t *lcp_result)

{
  lcp_t *plVar1;
  undefined8 *puVar2;
  char *pcVar3;
  uchar *puVar4;
  uchar *__s1;
  ulong uVar5;
  char cVar6;
  int iVar7;
  ostream *poVar8;
  size_t sVar9;
  uchar **ppuVar10;
  size_t sVar11;
  ulong uVar12;
  uchar **ppuVar13;
  ulong *puVar14;
  uchar **ppuVar15;
  uchar **__dest;
  ulong *puVar16;
  long lVar17;
  lcp_t lcp01;
  size_t local_88;
  ulong local_80;
  ulong *local_78;
  uchar **local_70;
  uchar **local_68;
  ulong *local_60;
  uchar local_48;
  undefined7 uStack_47;
  int local_40;
  ulong local_38;
  
  local_78 = lcp_result;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"merge_lcp_2way_unstable",0x17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(): n0=",7);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", n1=",5);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  local_48 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_48,1);
  check_input(from0,lcp_input0,n0);
  check_input(from1,lcp_input1,n1);
  compare(&local_48,*from0,(size_t)*from1);
  local_80 = CONCAT71(uStack_47,local_48);
  local_38 = local_80;
  __dest = result + 1;
  if (local_40 < 1) {
    local_68 = from0 + 1;
    *result = *from0;
    local_80 = *lcp_input0;
    local_60 = lcp_input0 + 1;
    local_88 = n0 - 1;
    puVar16 = &local_38;
    ppuVar15 = (uchar **)lcp_input1;
LAB_0023f477:
    uVar12 = *puVar16;
LAB_0023f482:
    do {
      puVar14 = (ulong *)ppuVar15;
      ppuVar13 = from1;
      puVar16 = lcp_result;
      ppuVar10 = __dest;
      lVar17 = 0;
      while( true ) {
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Starting loop, n0=",0x12);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", n1=",5);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," ...\n",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tprev  = \'",10);
        pcVar3 = *(char **)((long)ppuVar10 + lVar17 + -8);
        iVar7 = (int)poVar8;
        if (pcVar3 == (char *)0x0) {
          std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
        }
        else {
          sVar9 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar3,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'\n",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tfrom0 = \'",10);
        puVar4 = *local_68;
        if (puVar4 == (uchar *)0x0) {
          std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
        }
        else {
          sVar9 = strlen((char *)puVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)puVar4,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'\n",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tfrom1 = \'",10);
        pcVar3 = *(char **)((long)ppuVar13 + lVar17);
        if (pcVar3 == (char *)0x0) {
          std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
        }
        else {
          sVar9 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar3,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'\n",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tlcp0  = ",9);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tlcp1  = ",9);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        check_lcps(*(uchar **)((long)ppuVar10 + lVar17 + -8),*local_68,local_80,
                   *(uchar **)((long)ppuVar13 + lVar17),uVar12);
        sVar11 = n1;
        if (uVar12 < local_80) {
          puVar4 = *local_68;
          if (puVar4 == (uchar *)0x0) goto LAB_0023fc1f;
          if (*(char **)((long)ppuVar13 + lVar17) == (char *)0x0) goto LAB_0023fc3e;
          iVar7 = strcmp((char *)puVar4,*(char **)((long)ppuVar13 + lVar17));
          if (-1 < iVar7) {
            __assert_fail("cmp(*from0, *from1) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x64f,
                          "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = true]"
                         );
          }
          local_68 = local_68 + 1;
          *(undefined8 *)((long)ppuVar10 + lVar17) = puVar4;
          lcp_result = (lcp_t *)((long)puVar16 + lVar17 + 8);
          lcp_result[-1] = local_80;
          local_80 = *local_60;
          local_60 = local_60 + 1;
          local_88 = local_88 - 1;
          __dest = (uchar **)((undefined8 *)((long)ppuVar10 + lVar17) + 1);
          from1 = (uchar **)((long)ppuVar13 + lVar17);
          ppuVar15 = (uchar **)((long)puVar14 + lVar17);
          if (local_88 != 0) goto LAB_0023f482;
          local_70 = (uchar **)((long)ppuVar13 + lVar17);
          __dest = (uchar **)((long)ppuVar10 + lVar17 + 8);
          local_78 = (ulong *)((long)puVar16 + lVar17 + 8);
          local_88 = 0;
          ppuVar15 = (uchar **)((long)puVar14 + lVar17);
          goto LAB_0023fb45;
        }
        if (uVar12 <= local_80) break;
        if (*local_68 == (uchar *)0x0) goto LAB_0023fc1f;
        pcVar3 = *(char **)((long)ppuVar13 + lVar17);
        if (pcVar3 == (char *)0x0) goto LAB_0023fc3e;
        iVar7 = strcmp((char *)*local_68,pcVar3);
        if (iVar7 < 1) {
          __assert_fail("cmp(*from0, *from1) > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x655,
                        "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = true]"
                       );
        }
        *(char **)((long)ppuVar10 + lVar17) = pcVar3;
        *(ulong *)((long)puVar16 + lVar17) = uVar12;
        uVar12 = *(ulong *)((long)puVar14 + lVar17);
        lVar17 = lVar17 + 8;
        n1 = n1 - 1;
        if (n1 == 0) {
          __dest = (uchar **)((long)ppuVar10 + lVar17);
          local_78 = (ulong *)((long)puVar16 + lVar17);
          sVar11 = 0;
          goto LAB_0023fa25;
        }
      }
      local_70 = (uchar **)((long)ppuVar13 + lVar17);
      compare(&local_48,*local_68,*(size_t *)((long)ppuVar13 + lVar17));
      uVar5 = CONCAT71(uStack_47,local_48);
      ppuVar15 = (uchar **)((long)puVar14 + lVar17);
      if (local_40 < 0) {
        puVar4 = *local_68;
        local_68 = local_68 + 1;
        __dest = (uchar **)((undefined8 *)((long)ppuVar10 + lVar17) + 1);
        *(undefined8 *)((long)ppuVar10 + lVar17) = puVar4;
        local_78 = (lcp_t *)((long)puVar16 + lVar17) + 1;
        *(lcp_t *)((long)puVar16 + lVar17) = local_80;
        local_88 = local_88 - 1;
        uVar12 = uVar5;
        if (local_88 == 0) {
          cVar6 = '\x02';
          local_88 = 0;
        }
        else {
          cVar6 = '\0';
          local_80 = *local_60;
          local_60 = local_60 + 1;
        }
      }
      else {
        puVar4 = *local_70;
        if (local_40 == 0) {
          __s1 = *local_68;
          if (__s1 == (uchar *)0x0) {
LAB_0023fc1f:
            __assert_fail("a != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x51,"int cmp(const unsigned char *, const unsigned char *)");
          }
          if (puVar4 == (uchar *)0x0) {
LAB_0023fc3e:
            __assert_fail("b != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x52,"int cmp(const unsigned char *, const unsigned char *)");
          }
          iVar7 = strcmp((char *)__s1,(char *)puVar4);
          if (iVar7 != 0) {
            __assert_fail("cmp(*from0, *from1)==0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x664,
                          "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = true]"
                         );
          }
          if (local_88 == 0) {
            pcVar3 = "not n0";
LAB_0023fce9:
            __assert_fail(pcVar3 + 4,
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x665,
                          "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = true]"
                         );
          }
          if (n1 == 0) {
            pcVar3 = "not n1";
            goto LAB_0023fce9;
          }
          plVar1 = (lcp_t *)((long)puVar16 + lVar17);
          local_78 = plVar1 + 2;
          *plVar1 = local_80;
          plVar1[1] = uVar5;
          local_68 = local_68 + 1;
          puVar2 = (undefined8 *)((long)ppuVar10 + lVar17);
          __dest = (uchar **)(puVar2 + 2);
          *puVar2 = __s1;
          local_70 = (uchar **)((long)ppuVar13 + lVar17 + 8);
          puVar2[1] = local_70[-1];
          sVar11 = n1 - 1;
          ppuVar15 = (uchar **)((ulong *)((long)puVar14 + lVar17) + 1);
          uVar12 = *(ulong *)((long)puVar14 + lVar17);
          local_88 = local_88 - 1;
          local_80 = *local_60;
          if (local_88 == 0) {
            cVar6 = '\x02';
            local_88 = 0;
            local_60 = local_60 + 1;
          }
          else {
            cVar6 = (n1 == 1) * '\x03';
            local_60 = local_60 + 1;
          }
        }
        else {
          local_70 = (uchar **)((long)ppuVar13 + lVar17 + 8);
          __dest = (uchar **)((long)ppuVar10 + lVar17 + 8);
          __dest[-1] = puVar4;
          local_78 = (lcp_t *)((long)puVar16 + lVar17) + 1;
          *(lcp_t *)((long)puVar16 + lVar17) = local_80;
          local_80 = uVar5;
          if (n1 == 1) {
            cVar6 = '\x03';
            sVar11 = 0;
          }
          else {
            sVar11 = n1 - 1;
            ppuVar15 = (uchar **)((ulong *)((long)puVar14 + lVar17) + 1);
            uVar12 = *(ulong *)((long)puVar14 + lVar17);
            cVar6 = '\0';
          }
        }
      }
      n1 = sVar11;
      lcp_result = local_78;
      from1 = local_70;
    } while (cVar6 == '\0');
    if (cVar6 == '\x01') {
      return;
    }
    if (cVar6 != '\x03') {
LAB_0023fb45:
      local_68 = ppuVar15;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      local_48 = '~';
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_48,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"merge_lcp_2way_unstable",0x17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(): n0=",7);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", n1=",5);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      local_48 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_48,1);
      if (local_88 != 0) {
        __assert_fail("not n0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x67b,
                      "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = true]"
                     );
      }
      if (sVar11 == 0) {
        return;
      }
      memmove(__dest,local_70,sVar11 * 8);
      *local_78 = uVar12;
      local_60 = (ulong *)local_68;
      goto LAB_0023fafe;
    }
  }
  else {
    *result = *from1;
    n1 = n1 - 1;
    local_60 = lcp_input0;
    local_88 = n0;
    local_68 = from0;
    if (n1 != 0) {
      from1 = from1 + 1;
      ppuVar15 = (uchar **)(lcp_input1 + 1);
      puVar16 = lcp_input1;
      goto LAB_0023f477;
    }
    sVar11 = 0;
  }
LAB_0023fa25:
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  local_48 = '~';
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_48,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"merge_lcp_2way_unstable",0x17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(): n0=",7);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", n1=",5);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  local_48 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_48,1);
  if (sVar11 != 0) {
    __assert_fail("not n1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x684,
                  "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = true]"
                 );
  }
  if (local_88 == 0) {
    return;
  }
  memmove(__dest,local_68,local_88 * 8);
  *local_78 = local_80;
  sVar11 = local_88;
LAB_0023fafe:
  memmove(local_78 + 1,local_60,sVar11 << 3);
  return;
}

Assistant:

static void
merge_lcp_2way_unstable(
               unsigned char** from0,  lcp_t* restrict lcp_input0, size_t n0,
               unsigned char** from1,  lcp_t* restrict lcp_input1, size_t n1,
               unsigned char** result, lcp_t* restrict lcp_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	check_input(from0, lcp_input0, n0);
	check_input(from1, lcp_input1, n1);
	lcp_t lcp0=0, lcp1=0;
	int cmp01; lcp_t lcp01;
	std::tie(cmp01, lcp01) = compare(*from0, *from1);
	if (cmp01 <= 0) {
		*result++ = *from0++;
		lcp0 = *lcp_input0++;
		lcp1 = lcp01;
		if (--n0 == 0) goto finish0;
	} else {
		*result++ = *from1++;
		lcp1 = *lcp_input1++;
		lcp0 = lcp01;
		if (--n1 == 0) goto finish1;
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
		        << "\tprev  = '" <<*(result-1)<<"'\n"
		        << "\tfrom0 = '"<<*from0<<"'\n"
		        << "\tfrom1 = '"<<*from1<<"'\n"
		        << "\tlcp0  = " << lcp0 << "\n"
		        << "\tlcp1  = " << lcp1 << "\n"
		        << "\n";
		check_lcps(*(result-1),*from0,lcp0,*from1,lcp1);
		if (lcp0 > lcp1) {
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			lcp0 = *lcp_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			lcp1 = *lcp_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			int cmp01; lcp_t lcp01;
			std::tie(cmp01,lcp01) = compare(*from0, *from1, lcp0);
			if (cmp01 < 0) {
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				lcp1 = lcp01;
				if (--n0 == 0) goto finish0;
				lcp0 = *lcp_input0++;
			} else if (cmp01 == 0) {
				assert(cmp(*from0, *from1)==0);
				assert(n0); assert(n1);
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *lcp_result++ = lcp01;
				*result++ = *from0++;
				*result++ = *from1++;
				--n0;
				--n1;
				lcp0 = *lcp_input0++;
				lcp1 = *lcp_input1++;
				if (n0 == 0) goto finish0;
				if (n1 == 0) goto finish1;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp0;
				lcp0 = lcp01;
				if (--n1 == 0) goto finish1;
				lcp1 = *lcp_input1++;
			}
		}
	}
finish0:
	debug() << '~' << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	assert(not n0);
	if (n1) {
		std::copy(from1, from1+n1, result);
		if (OutputLCP) *lcp_result++ = lcp1;
		if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	}
	return;
finish1:
	debug() << '~' << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	assert(not n1);
	if (n0) {
		std::copy(from0, from0+n0, result);
		if (OutputLCP) *lcp_result++ = lcp0;
		if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	}
	return;
}